

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O0

Component __thiscall
ftxui::Checkbox(ftxui *this,ConstStringRef *label,bool *checked,Ref<ftxui::CheckboxOption> *option)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  undefined1 local_38 [24];
  Ref<ftxui::CheckboxOption> *option_local;
  bool *checked_local;
  ConstStringRef *label_local;
  
  local_38._16_8_ = option;
  option_local = (Ref<ftxui::CheckboxOption> *)checked;
  checked_local = (bool *)label;
  label_local = (ConstStringRef *)this;
  Make<ftxui::(anonymous_namespace)::CheckboxBase,ftxui::ConstStringRef&,bool*&,ftxui::Ref<ftxui::CheckboxOption>>
            ((ConstStringRef *)local_38,(bool **)label,(Ref<ftxui::CheckboxOption> *)&option_local);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr<ftxui::(anonymous_namespace)::CheckboxBase,void>
            ((shared_ptr<ftxui::ComponentBase> *)this,
             (shared_ptr<ftxui::(anonymous_namespace)::CheckboxBase> *)local_38);
  std::shared_ptr<ftxui::(anonymous_namespace)::CheckboxBase>::~shared_ptr
            ((shared_ptr<ftxui::(anonymous_namespace)::CheckboxBase> *)local_38);
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Checkbox(ConstStringRef label,
                   bool* checked,
                   Ref<CheckboxOption> option) {
  return Make<CheckboxBase>(label, checked, std::move(option));
}